

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<int>::swap(PropertyT<int> *this,size_t _i0,size_t _i1)

{
  int iVar1;
  pointer piVar2;
  
  piVar2 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[_i0];
  piVar2[_i0] = piVar2[_i1];
  piVar2[_i1] = iVar1;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }